

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

void __thiscall Inferences::CompositeSGI::detach(CompositeSGI *this)

{
  GeneratingInferenceEngine **ppGVar1;
  SimplifyingGeneratingInference **ppSVar2;
  GeneratingInferenceEngine **ppGVar3;
  SimplifyingGeneratingInference **ppSVar4;
  
  ppGVar1 = (this->_generators)._cursor;
  for (ppGVar3 = (this->_generators)._stack; ppGVar3 != ppGVar1; ppGVar3 = ppGVar3 + 1) {
    (*((*ppGVar3)->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine
      [3])();
  }
  ppSVar2 = (this->_simplifiers)._cursor;
  for (ppSVar4 = (this->_simplifiers)._stack; ppSVar4 != ppSVar2; ppSVar4 = ppSVar4 + 1) {
    (*((*ppSVar4)->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  return;
}

Assistant:

void CompositeSGI::detach()
{ 
  for (auto g : _generators) {
    g->detach();
  }
  for (auto s : _simplifiers) {
    s->detach();
  }
}